

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::LowerLdSlot(Lowerer *this,Instr *instr)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  Opnd *this_00;
  Opnd *pOVar4;
  undefined4 *puVar5;
  
  this_00 = IR::Instr::UnlinkSrc1(instr);
  pOVar4 = this_00;
  if (this_00 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2b91,"(srcOpnd)","Expected src opnd on LdSlot");
    if (!bVar2) goto LAB_005b789c;
    *puVar5 = 0;
    pOVar4 = (Opnd *)0x0;
  }
  pOVar4 = CreateOpndForSlotAccess(this,pOVar4);
  IR::Opnd::Free(this_00,this->m_func);
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar2) goto LAB_005b789c;
    *puVar5 = 0;
  }
  func = instr->m_func;
  if (pOVar4->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar2) {
LAB_005b789c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar3 = pOVar4->field_0xb;
  if ((bVar3 & 2) != 0) {
    pOVar4 = IR::Opnd::Copy(pOVar4,func);
    bVar3 = pOVar4->field_0xb;
  }
  pOVar4->field_0xb = bVar3 | 2;
  instr->m_src1 = pOVar4;
  LowererMD::ChangeToAssign(instr);
  return;
}

Assistant:

void
Lowerer::LowerLdSlot(IR::Instr *instr)
{
    IR::Opnd * srcOpnd = instr->UnlinkSrc1();
    AssertMsg(srcOpnd, "Expected src opnd on LdSlot");
    IR::Opnd * srcNew = this->CreateOpndForSlotAccess(srcOpnd);
    srcOpnd->Free(this->m_func);

    instr->SetSrc1(srcNew);
        m_lowererMD.ChangeToAssign(instr);
    }